

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.h
# Opt level: O0

void __thiscall
TPZSYsmpMatrix<std::complex<double>_>::CopyFrom
          (TPZSYsmpMatrix<std::complex<double>_> *this,TPZMatrix<std::complex<double>_> *mat)

{
  TPZSYsmpMatrix<std::complex<double>_> *this_00;
  long in_RSI;
  TPZSYsmpMatrix<std::complex<double>_> *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZSYsmpMatrix<std::complex<double>_> *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZSYsmpMatrix<std::complex<double>_> *)0x0;
  }
  else {
    this_00 = (TPZSYsmpMatrix<std::complex<double>_> *)
              __dynamic_cast(in_RSI,&TPZMatrix<std::complex<double>>::typeinfo,
                             &TPZSYsmpMatrix<std::complex<double>>::typeinfo,0);
  }
  if (this_00 == (TPZSYsmpMatrix<std::complex<double>_> *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZSYsmpMatrix<std::complex<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSYsmpMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }